

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

char * llvm::writeSignedDecimal(char *dst,int value)

{
  char *pcStack_10;
  int value_local;
  char *dst_local;
  
  if (value < 0) {
    *dst = '-';
    pcStack_10 = writeUnsignedDecimal(dst + 1,-value);
  }
  else {
    pcStack_10 = writeUnsignedDecimal(dst,value);
  }
  return pcStack_10;
}

Assistant:

static char *
writeSignedDecimal (char *dst, int value)
{
  if (value < 0) {
    *dst++ = '-';
    dst = writeUnsignedDecimal(dst, -(unsigned) value);
  } else
    dst = writeUnsignedDecimal(dst, value);

  return dst;
}